

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GraphicBasicTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)13>_> *this_00;
  Move<vk::Handle<(vk::HandleType)13>_> *this_01;
  Move<vk::Handle<(vk::HandleType)17>_> *this_02;
  VkImage VVar1;
  VkSubpassDescription subpass;
  VkAttachmentDescription attachment;
  VkAttachmentDescription attachment_00;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar2;
  long lVar3;
  ImageCreateInfo *pIVar4;
  undefined8 *puVar5;
  byte bVar6;
  VkExtent3D _extent;
  VkExtent3D _extent_00;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  VkStructureType VVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  VkImageCreateFlags VVar19;
  VkImageType VVar20;
  VkFormat VVar21;
  deUint32 dVar22;
  deUint32 dVar23;
  undefined4 uVar24;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_278;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  attachments;
  VkAllocationCallbacks *pVStack_240;
  ImageViewCreateInfo depthViewInfo;
  ImageCreateInfo depthImageCreateInfo;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  ImageViewCreateInfo attachmentViewInfo;
  ImageCreateInfo colorImageCreateInfo;
  
  bVar6 = 0;
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  vk = Context::getDeviceInterface
                 ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_StatisticQueryTestInstance).super_TestInstance.m_context)
  ;
  _extent.depth = 1;
  _extent.width = 0x40;
  _extent.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&colorImageCreateInfo,VK_IMAGE_TYPE_2D,this->m_colorAttachmentFormat,_extent,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x11,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar2 = Context::getDefaultAllocator
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthImageCreateInfo,vk,device,&colorImageCreateInfo.super_VkImageCreateInfo,
             pAVar2,(MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_colorAttachmentImage,(SharedPtr<vkt::Draw::Image> *)&depthImageCreateInfo);
  de::SharedPtr<vkt::Draw::Image>::release((SharedPtr<vkt::Draw::Image> *)&depthImageCreateInfo);
  VVar1.m_internal =
       (((this->m_colorAttachmentImage).m_ptr)->m_object).
       super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  VVar21 = this->m_colorAttachmentFormat;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&depthImageCreateInfo,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G
             ,VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&attachmentViewInfo,VVar1,VK_IMAGE_VIEW_TYPE_2D,VVar21,
             (VkComponentMapping *)&depthImageCreateInfo,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo,vk,device,
             &attachmentViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  depthImageCreateInfo.super_VkImageCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.format =
       (undefined4)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  depthImageCreateInfo.super_VkImageCreateInfo.extent.width =
       depthViewInfo.super_VkImageViewCreateInfo.image.m_internal._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  this_00 = &this->m_attachmentView;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)depthImageCreateInfo.super_VkImageCreateInfo._16_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)depthImageCreateInfo.super_VkImageCreateInfo._24_8_;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       depthImageCreateInfo.super_VkImageCreateInfo._0_8_;
  (this->m_attachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&depthViewInfo);
  uVar11 = 0;
  uVar12 = 0;
  uVar9 = 1;
  uVar10 = 0;
  uVar7 = 1;
  uVar8 = 0;
  _extent_00.depth = 1;
  _extent_00.width = 0x40;
  _extent_00.height = 0x40;
  Draw::ImageCreateInfo::ImageCreateInfo
            (&depthImageCreateInfo,VK_IMAGE_TYPE_2D,VK_FORMAT_D16_UNORM,_extent_00,1,1,
             VK_SAMPLE_COUNT_1_BIT,VK_IMAGE_TILING_OPTIMAL,0x20,VK_SHARING_MODE_EXCLUSIVE,0,
             (deUint32 *)0x0,0,VK_IMAGE_LAYOUT_UNDEFINED);
  pAVar2 = Context::getDefaultAllocator
                     ((this->super_StatisticQueryTestInstance).super_TestInstance.m_context);
  Draw::Image::createAndAlloc
            ((Image *)&depthViewInfo,vk,device,&depthImageCreateInfo.super_VkImageCreateInfo,pAVar2,
             (MemoryRequirement)0x0);
  de::SharedPtr<vkt::Draw::Image>::operator=
            (&this->m_depthImage,(SharedPtr<vkt::Draw::Image> *)&depthViewInfo);
  de::SharedPtr<vkt::Draw::Image>::release((SharedPtr<vkt::Draw::Image> *)&depthViewInfo);
  VVar1.m_internal =
       (((this->m_depthImage).m_ptr)->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data
       .object.m_internal;
  Draw::ComponentMapping::ComponentMapping
            ((ComponentMapping *)&local_278,VK_COMPONENT_SWIZZLE_R,VK_COMPONENT_SWIZZLE_G,
             VK_COMPONENT_SWIZZLE_B,VK_COMPONENT_SWIZZLE_A);
  Draw::ImageViewCreateInfo::ImageViewCreateInfo
            (&depthViewInfo,VVar1,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_D16_UNORM,
             (VkComponentMapping *)&local_278,0);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&attachments,vk,device,
             &depthViewInfo.super_VkImageViewCreateInfo,(VkAllocationCallbacks *)0x0);
  local_278.m_data.deleter.m_device =
       (VkDevice)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_278.m_data.deleter.m_allocator = pVStack_240;
  local_278.m_data.object.m_internal =
       (deUint64)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_278.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       attachments.
       super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->m_depthiew;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       local_278.m_data.deleter.m_device;
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       local_278.m_data.deleter.m_allocator;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       local_278.m_data.object.m_internal;
  (this->m_depthiew).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       local_278.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&attachments);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&depthImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&colorImageCreateInfo.m_queueFamilyIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  Draw::RenderPassCreateInfo::RenderPassCreateInfo
            ((RenderPassCreateInfo *)&colorImageCreateInfo,0,(VkAttachmentDescription *)0x0,0,
             (VkSubpassDescription *)0x0,0,(VkSubpassDependency *)0x0);
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,this->m_colorAttachmentFormat,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_STORE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_STORE,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  attachment.samples = (int)depthImageCreateInfo.super_VkImageCreateInfo.pNext;
  attachment.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment.loadOp = (int)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  attachment.storeOp = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  attachment.stencilLoadOp = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  attachment.stencilStoreOp = depthImageCreateInfo.super_VkImageCreateInfo.format;
  attachment.initialLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  attachment.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment);
  uVar24 = 0;
  Draw::AttachmentDescription::AttachmentDescription
            ((AttachmentDescription *)&depthImageCreateInfo,VK_FORMAT_D16_UNORM,
             VK_SAMPLE_COUNT_1_BIT,VK_ATTACHMENT_LOAD_OP_CLEAR,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_ATTACHMENT_LOAD_OP_DONT_CARE,VK_ATTACHMENT_STORE_OP_DONT_CARE,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL);
  VVar19 = depthImageCreateInfo.super_VkImageCreateInfo.flags;
  VVar20 = depthImageCreateInfo.super_VkImageCreateInfo.imageType;
  VVar21 = depthImageCreateInfo.super_VkImageCreateInfo.format;
  dVar22 = depthImageCreateInfo.super_VkImageCreateInfo.extent.width;
  VVar15 = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  uVar16 = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  uVar17 = SUB84(depthImageCreateInfo.super_VkImageCreateInfo.pNext,0);
  uVar18 = (undefined4)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext >> 0x20);
  uVar13 = 0x697693;
  uVar14 = 0;
  attachment_00.samples = uVar17;
  attachment_00.flags = depthImageCreateInfo.super_VkImageCreateInfo.sType;
  attachment_00.format = depthImageCreateInfo.super_VkImageCreateInfo._4_4_;
  attachment_00.loadOp = uVar18;
  attachment_00.storeOp = VVar19;
  attachment_00.stencilLoadOp = VVar20;
  attachment_00.stencilStoreOp = VVar21;
  attachment_00.initialLayout = dVar22;
  attachment_00.finalLayout = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  dVar23 = depthImageCreateInfo.super_VkImageCreateInfo.extent.height;
  Draw::RenderPassCreateInfo::addAttachment
            ((RenderPassCreateInfo *)&colorImageCreateInfo,attachment_00);
  depthImageCreateInfo.super_VkImageCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthImageCreateInfo.super_VkImageCreateInfo._4_4_ = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.pNext =
       (void *)((ulong)depthImageCreateInfo.super_VkImageCreateInfo.pNext & 0xffffffff00000000);
  depthImageCreateInfo.super_VkImageCreateInfo.flags = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.imageType = VK_IMAGE_TYPE_1D;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  depthImageCreateInfo.super_VkImageCreateInfo.format = VK_FORMAT_R4G4_UNORM_PACK8;
  depthImageCreateInfo.super_VkImageCreateInfo.extent._4_8_ = &colorAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.mipLevels = 0;
  depthImageCreateInfo.super_VkImageCreateInfo.arrayLayers = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._48_8_ = &depthAttachmentReference;
  depthImageCreateInfo.super_VkImageCreateInfo.usage = 0;
  depthAttachmentReference.attachment = 1;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  depthImageCreateInfo.super_VkImageCreateInfo.queueFamilyIndexCount = 0;
  depthImageCreateInfo.super_VkImageCreateInfo._68_4_ = 0;
  pIVar4 = &depthImageCreateInfo;
  puVar5 = (undefined8 *)&stack0xfffffffffffffd28;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)&pIVar4->super_VkImageCreateInfo;
    pIVar4 = (ImageCreateInfo *)((long)pIVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  subpass.pipelineBindPoint = uVar8;
  subpass.flags = uVar7;
  subpass.inputAttachmentCount = uVar9;
  subpass._12_4_ = uVar10;
  subpass.pInputAttachments._0_4_ = uVar11;
  subpass.pInputAttachments._4_4_ = uVar12;
  subpass.colorAttachmentCount = uVar13;
  subpass._28_4_ = uVar14;
  subpass.pColorAttachments._0_4_ = VVar15;
  subpass.pColorAttachments._4_4_ = uVar16;
  subpass.pResolveAttachments._0_4_ = uVar17;
  subpass.pResolveAttachments._4_4_ = uVar18;
  subpass.pDepthStencilAttachment._0_4_ = VVar19;
  subpass.pDepthStencilAttachment._4_4_ = VVar20;
  subpass.preserveAttachmentCount = VVar21;
  subpass._60_4_ = dVar22;
  subpass.pPreserveAttachments._0_4_ = dVar23;
  subpass.pPreserveAttachments._4_4_ = uVar24;
  Draw::RenderPassCreateInfo::addSubpass((RenderPassCreateInfo *)&colorImageCreateInfo,subpass);
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&depthViewInfo,vk,device,
             (VkRenderPassCreateInfo *)&colorImageCreateInfo,(VkAllocationCallbacks *)0x0);
  attachmentViewInfo.super_VkImageViewCreateInfo.flags =
       depthViewInfo.super_VkImageViewCreateInfo.flags;
  attachmentViewInfo.super_VkImageViewCreateInfo._20_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._20_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.image =
       depthViewInfo.super_VkImageViewCreateInfo.image;
  attachmentViewInfo.super_VkImageViewCreateInfo.sType =
       depthViewInfo.super_VkImageViewCreateInfo.sType;
  attachmentViewInfo.super_VkImageViewCreateInfo._4_4_ =
       depthViewInfo.super_VkImageViewCreateInfo._4_4_;
  attachmentViewInfo.super_VkImageViewCreateInfo.pNext =
       depthViewInfo.super_VkImageViewCreateInfo.pNext;
  depthViewInfo.super_VkImageViewCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthViewInfo.super_VkImageViewCreateInfo._4_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = (void *)0x0;
  depthViewInfo.super_VkImageViewCreateInfo.flags = 0;
  depthViewInfo.super_VkImageViewCreateInfo._20_4_ = 0;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal = 0;
  this_02 = &this->m_renderPass;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)attachmentViewInfo.super_VkImageViewCreateInfo._16_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)attachmentViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       attachmentViewInfo.super_VkImageViewCreateInfo._0_8_;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)attachmentViewInfo.super_VkImageViewCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&depthViewInfo);
  std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  vector(&attachments,2,(allocator_type *)&attachmentViewInfo);
  (attachments.
   super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  attachments.
  super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].m_internal =
       (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  Draw::FramebufferCreateInfo::FramebufferCreateInfo
            ((FramebufferCreateInfo *)&attachmentViewInfo,
             (VkRenderPass)
             (this_02->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal,
             &attachments,0x40,0x40,1);
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&local_278,vk,device,
             (VkFramebufferCreateInfo *)&attachmentViewInfo,(VkAllocationCallbacks *)0x0);
  depthViewInfo.super_VkImageViewCreateInfo._16_8_ = local_278.m_data.deleter.m_device;
  depthViewInfo.super_VkImageViewCreateInfo.image.m_internal =
       (deUint64)local_278.m_data.deleter.m_allocator;
  depthViewInfo.super_VkImageViewCreateInfo._0_8_ = local_278.m_data.object.m_internal;
  depthViewInfo.super_VkImageViewCreateInfo.pNext = local_278.m_data.deleter.m_deviceIface;
  local_278.m_data.object.m_internal = 0;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_278.m_data.deleter.m_device = (VkDevice)0x0;
  local_278.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::reset
            (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)depthViewInfo.super_VkImageViewCreateInfo._16_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)depthViewInfo.super_VkImageViewCreateInfo.image.m_internal;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       depthViewInfo.super_VkImageViewCreateInfo._0_8_;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)depthViewInfo.super_VkImageViewCreateInfo.pNext;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_278);
  std::
  _Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
  ~_Vector_base(&attachments.
                 super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
               );
  Draw::RenderPassCreateInfo::~RenderPassCreateInfo((RenderPassCreateInfo *)&colorImageCreateInfo);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[4])(this);
  (*(this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance[5])
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GraphicBasicTestInstance::iterate (void)
{
	checkExtensions();
	creatColorAttachmentAndRenderPass();
	createPipeline();
	return executeTest();
}